

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall
ipx::Basis::TableauRow(Basis *this,Int jb,IndexedVector *btran,IndexedVector *row,bool ignore_fixed)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  double *pdVar6;
  pointer piVar7;
  pointer piVar8;
  double *pdVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  Model *pMVar20;
  double dVar21;
  
  iVar19 = this->model_->num_rows_;
  iVar13 = this->model_->num_cols_;
  SolveForUpdate(this,jb,btran);
  bVar10 = IndexedVector::sparse(btran);
  if (bVar10) {
    piVar2 = (btran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar20 = this->model_;
    if ((long)btran->nnz_ < 1) {
      dVar21 = 0.0;
    }
    else {
      piVar3 = (pMVar20->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = 0;
      iVar12 = 0;
      do {
        lVar16 = (long)piVar2[lVar15];
        iVar12 = (iVar12 + piVar3[lVar16 + 1]) - piVar3[lVar16];
        lVar15 = lVar15 + 1;
      } while (btran->nnz_ != lVar15);
      dVar21 = (double)(iVar12 / 2);
    }
    if (dVar21 <= (double)iVar13 * 0.1) {
      piVar3 = (pMVar20->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (pMVar20->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      IndexedVector::set_to_zero(row);
      iVar19 = btran->nnz_;
      if (iVar19 < 1) {
        uVar11 = 0;
      }
      else {
        piVar5 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (btran->elements_)._M_data;
        piVar7 = (pMVar20->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = 0;
        uVar11 = 0;
        do {
          lVar16 = (long)piVar2[lVar15];
          iVar13 = piVar7[lVar16];
          lVar18 = (long)iVar13;
          iVar12 = piVar7[lVar16 + 1];
          if (iVar13 < iVar12) {
            dVar21 = pdVar6[lVar16];
            pdVar9 = (row->elements_)._M_data;
            do {
              iVar19 = piVar3[lVar18];
              iVar13 = piVar8[iVar19];
              if (iVar13 == -1 || iVar13 == -2 && !ignore_fixed) {
                piVar8[iVar19] = iVar13 + -2;
                lVar16 = (long)(int)uVar11;
                uVar11 = uVar11 + 1;
                piVar5[lVar16] = iVar19;
                iVar13 = piVar8[iVar19];
              }
              if (iVar13 < -2) {
                pdVar9[iVar19] = pdVar4[lVar18] * dVar21 + pdVar9[iVar19];
              }
              lVar18 = lVar18 + 1;
            } while (iVar12 != lVar18);
            iVar19 = btran->nnz_;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar19);
        if (0 < (int)uVar11) {
          piVar2 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar17 = 0;
          do {
            piVar1 = piVar2 + piVar5[uVar17];
            *piVar1 = *piVar1 + 2;
            uVar17 = uVar17 + 1;
          } while (uVar11 != uVar17);
        }
      }
      goto LAB_0038dee4;
    }
  }
  else {
    pMVar20 = this->model_;
  }
  uVar11 = 0xffffffff;
  uVar14 = iVar13 + iVar19;
  if (uVar14 != 0 && SCARRY4(iVar13,iVar19) == (int)uVar14 < 0) {
    piVar2 = (pMVar20->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (pMVar20->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (btran->elements_)._M_data;
    pdVar9 = (row->elements_)._M_data;
    uVar17 = 0;
    do {
      iVar19 = piVar3[uVar17];
      dVar21 = 0.0;
      if (iVar19 == -1 || iVar19 == -2 && !ignore_fixed) {
        piVar5 = (pMVar20->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar19 = piVar5[uVar17];
        lVar15 = (long)iVar19;
        iVar13 = piVar5[uVar17 + 1];
        if (iVar19 < iVar13) {
          do {
            dVar21 = dVar21 + pdVar4[lVar15] * pdVar6[piVar2[lVar15]];
            lVar15 = lVar15 + 1;
          } while (iVar13 != lVar15);
        }
      }
      pdVar9[uVar17] = dVar21;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar14);
  }
LAB_0038dee4:
  row->nnz_ = uVar11;
  return;
}

Assistant:

void Basis::TableauRow(Int jb, IndexedVector& btran, IndexedVector& row,
                       bool ignore_fixed) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    assert(IsBasic(jb));
    SolveForUpdate(jb, btran);

    // Estimate if tableau row is sparse.
    bool is_sparse = btran.sparse();
    if (is_sparse) {
        const SparseMatrix& AIt = model_.AIt();
        const Int* bi = btran.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            nz += AIt.end(i) - AIt.begin(i);
        }
        nz /= 2;                // guess for overlap
        if (nz > kHypersparseThreshold*n)
            is_sparse = false;
    }

    if (is_sparse) {
        // sparse vector * sparse matrix: accesses A rowwise
        const SparseMatrix& AIt = model_.AIt();
        const Int* Ati = AIt.rowidx();
        const double* Atx = AIt.values();
        const Int* bi = btran.pattern();
        row.set_to_zero();
        Int* row_pattern = row.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            double temp = btran[i];
            Int begin = AIt.begin(i);
            Int end = AIt.end(i);
            for (Int p = begin; p < end; p++) {
                Int j = Ati[p];
                if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed))
                {
                    map2basis_[j] -= 2; // mark column
                    row_pattern[nz++] = j;
                }
                if (map2basis_[j] < -2) // marked column
                    row[j] += temp * Atx[p];
            }
        }
        for (Int k = 0; k < nz; k++) // reset marked
            map2basis_[row_pattern[k]] += 2;
        row.set_nnz(nz);
    } else {
        // dense vector * sparse matrix: accesses A columnwise
        const SparseMatrix& AI = model_.AI();
        const Int* Ai = AI.rowidx();
        const double* Ax = AI.values();
        for (Int j = 0; j < n+m; j++) {
            double result = 0.0;
            if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed)) {
                Int begin = AI.begin(j);
                Int end = AI.end(j);
                for (Int p = begin; p < end; p++)
                    result += Ax[p] * btran[Ai[p]];
            }
            row[j] = result;
        }
        row.InvalidatePattern();
    }
}